

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O0

void scriptnum_tests::CheckCreateVch(int64_t *num)

{
  bool bVar1;
  lazy_ostream *this;
  uchar *puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tbs;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t in_R8;
  long in_FS_OFFSET;
  CScriptNum scriptnum3;
  CScriptNum10 bignum3;
  CScriptNum scriptnum2;
  CScriptNum10 bignum2;
  CScriptNum scriptnum;
  CScriptNum10 bignum;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  assertion_result *in_stack_fffffffffffffd68;
  assertion_result *this_00;
  lazy_ostream *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffd90;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffd98;
  assertion_result *this_01;
  undefined8 in_stack_fffffffffffffda0;
  undefined1 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffda8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vch;
  CScriptNum *in_stack_fffffffffffffdb0;
  const_string local_200 [2];
  lazy_ostream local_1e0 [2];
  assertion_result local_1c0;
  uchar local_1a8 [16];
  uchar local_170 [8];
  const_string local_168;
  EVP_PKEY_CTX local_150 [8];
  const_string local_148 [2];
  lazy_ostream local_128;
  assertion_result local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0 [2];
  uchar local_b8 [32];
  EVP_PKEY_CTX local_98 [8];
  const_string local_90 [2];
  lazy_ostream local_70 [2];
  assertion_result local_50;
  uchar local_38 [32];
  uchar local_18 [8];
  EVP_PKEY_CTX local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScriptNum10::CScriptNum10((CScriptNum10 *)in_stack_fffffffffffffd58,(int64_t *)0xa9a275);
  CScriptNum::CScriptNum((CScriptNum *)in_stack_fffffffffffffd58,(int64_t *)0xa9a28a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    puVar2 = local_38;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (const_string *)in_stack_fffffffffffffd80);
    verify(local_10,local_18,siglen,puVar2,in_R8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd58 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    in_R8 = 1;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,local_70,local_90,0x1e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    uVar3 = (undefined1)((ulong)in_stack_fffffffffffffda0 >> 0x38);
  } while (bVar1);
  CScriptNum10::getvch
            ((CScriptNum10 *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  CScriptNum10::CScriptNum10
            ((CScriptNum10 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(bool)uVar3,
             (size_t)in_stack_fffffffffffffd98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd68);
  CScriptNum::getvch((CScriptNum *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  CScriptNum::CScriptNum
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(bool)uVar3,
             (size_t)in_stack_fffffffffffffd98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd68);
  do {
    uVar3 = (undefined1)
            ((ulong)&local_f0[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    tbs = local_f0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    vch = tbs;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (const_string *)in_stack_fffffffffffffd80);
    verify(local_98,local_b8,siglen_00,(uchar *)tbs,in_R8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    this = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd58 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    in_R8 = 1;
    boost::test_tools::tt_detail::report_assertion
              (&local_108,&local_128,local_148,0x22,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  file = &local_168;
  CScriptNum::getvch((CScriptNum *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  CScriptNum10::CScriptNum10((CScriptNum10 *)this,vch,(bool)uVar3,(size_t)this_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd68);
  line_num = &stack0xfffffffffffffe78;
  CScriptNum10::getvch
            ((CScriptNum10 *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  CScriptNum::CScriptNum((CScriptNum *)this,vch,(bool)uVar3,(size_t)this_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd68);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    puVar2 = local_1a8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,file,(size_t)line_num,
               (const_string *)in_stack_fffffffffffffd80);
    verify(local_150,local_170,siglen_01,puVar2,in_R8);
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_fffffffffffffd67);
    in_stack_fffffffffffffd80 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd58 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    in_R8 = 1;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,local_1e0,local_200,0x26,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckCreateVch(const int64_t& num)
{
    CScriptNum10 bignum(num);
    CScriptNum scriptnum(num);
    BOOST_CHECK(verify(bignum, scriptnum));

    CScriptNum10 bignum2(bignum.getvch(), false);
    CScriptNum scriptnum2(scriptnum.getvch(), false);
    BOOST_CHECK(verify(bignum2, scriptnum2));

    CScriptNum10 bignum3(scriptnum2.getvch(), false);
    CScriptNum scriptnum3(bignum2.getvch(), false);
    BOOST_CHECK(verify(bignum3, scriptnum3));
}